

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O1

parser_error parse_prefs_monster_base(parser *p)

{
  monster_race *pmVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  char *pcVar4;
  monster_base *pmVar5;
  long lVar6;
  ulong uVar7;
  parser_error pVar8;
  
  pcVar4 = (char *)parser_priv(p);
  if (pcVar4 != (char *)0x0) {
    pVar8 = PARSE_ERROR_NONE;
    if (*pcVar4 == '\0') {
      pcVar4 = parser_getsym(p,"name");
      pmVar5 = lookup_monster_base(pcVar4);
      if (pmVar5 == (monster_base *)0x0) {
        pVar8 = PARSE_ERROR_NO_KIND_FOUND;
      }
      else {
        wVar2 = parser_getint(p,"attr");
        wVar3 = parser_getint(p,"char");
        pVar8 = PARSE_ERROR_NONE;
        if (z_info->r_max != 0) {
          lVar6 = 8;
          uVar7 = 0;
          do {
            pmVar1 = r_info;
            if (*(monster_base **)(r_info->flags + lVar6 + -0x3c) == pmVar5) {
              monster_x_attr[*(uint *)(r_info->flags + lVar6 + -0x5c)] = (uint8_t)wVar2;
              monster_x_char[*(uint *)(pmVar1->flags + lVar6 + -0x5c)] = wVar3;
            }
            uVar7 = uVar7 + 1;
            lVar6 = lVar6 + 0xd0;
          } while (uVar7 < z_info->r_max);
          pVar8 = PARSE_ERROR_NONE;
        }
      }
    }
    return pVar8;
  }
  __assert_fail("d != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                ,0x2c6,"enum parser_error parse_prefs_monster_base(struct parser *)");
}

Assistant:

static enum parser_error parse_prefs_monster_base(struct parser *p)
{
	const char *name;
	struct monster_base *mb;
	size_t i;
	uint8_t a;
	wchar_t c;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	name = parser_getsym(p, "name");
	mb = lookup_monster_base(name);
	if (!mb)
		return PARSE_ERROR_NO_KIND_FOUND;
	a = (uint8_t)parser_getint(p, "attr");
	c = (wchar_t)parser_getint(p, "char");

	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];

		if (race->base != mb) continue;

		monster_x_attr[race->ridx] = a;
		monster_x_char[race->ridx] = c;
	}

	return PARSE_ERROR_NONE;
}